

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

int __thiscall Patch::copy(Patch *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX EVar1;
  uint32_t uVar2;
  long lVar3;
  EVP_PKEY_CTX *__x;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar5;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 uVar6;
  EVP_PKEY_CTX *dst_00;
  Node *local_30;
  
  if (*(Node **)dst != (Node *)0x0) {
    iVar4 = Node::copy(*(Node **)dst,dst,src);
    local_30 = (Node *)CONCAT44(extraout_var,iVar4);
    if (*(long *)(dst + 0x10) != *(long *)(dst + 8)) {
      *(long *)(dst + 0x10) = *(long *)(dst + 8);
    }
    dst_00 = (EVP_PKEY_CTX *)&local_30;
    do {
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)(dst + 8),
                 (value_type *)dst_00);
      uVar5 = extraout_DL;
      uVar6 = extraout_var_02;
      do {
        lVar3 = *(long *)(dst + 0x10);
        if (*(long *)(dst + 8) == lVar3) goto LAB_001559d4;
        __x = *(EVP_PKEY_CTX **)(lVar3 + -8);
        *(long *)(dst + 0x10) = lVar3 + -8;
        if (*(Node **)__x != (Node *)0x0) {
          iVar4 = Node::copy(*(Node **)__x,dst_00,(EVP_PKEY_CTX *)CONCAT71(uVar6,uVar5));
          *(value_type *)__x = (value_type)CONCAT44(extraout_var_00,iVar4);
          dst_00 = __x;
          std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                    ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)(dst + 8),
                     (value_type *)__x);
          uVar5 = extraout_DL_00;
          uVar6 = extraout_var_03;
        }
      } while (*(Node **)(__x + 8) == (Node *)0x0);
      iVar4 = Node::copy(*(Node **)(__x + 8),dst_00,(EVP_PKEY_CTX *)CONCAT71(uVar6,uVar5));
      *(value_type *)(__x + 8) = (value_type)CONCAT44(extraout_var_01,iVar4);
      dst_00 = __x + 8;
    } while( true );
  }
  local_30 = (Node *)0x0;
LAB_001559d4:
  uVar2 = *(uint32_t *)(dst + 0x38);
  EVar1 = dst[0x3c];
  this->root = local_30;
  (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->left_ancestor_stack).
  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->left_ancestor_stack).
  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->left_ancestor_stack).
  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->change_count = uVar2;
  this->merges_adjacent_changes = (bool)EVar1;
  return (int)this;
}

Assistant:

Patch Patch::copy() {
  Node *new_root = nullptr;
  if (root) {
    new_root = root->copy();
    node_stack.clear();
    node_stack.push_back(new_root);

    while (!node_stack.empty()) {
      Node *node = node_stack.back();
      node_stack.pop_back();
      if (node->left) {
        node->left = node->left->copy();
        node_stack.push_back(node->left);
      }
      if (node->right) {
        node->right = node->right->copy();
        node_stack.push_back(node->right);
      }
    }
  }

  return Patch{new_root, change_count, merges_adjacent_changes};
}